

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QLayout::widgetEvent(QLayout *this,QEvent *e)

{
  short sVar1;
  QLayoutPrivate *this_00;
  QWidget *w;
  
  this_00 = *(QLayoutPrivate **)&this->field_0x8;
  sVar1 = *(short *)(e + 8);
  if ((sVar1 == 0x47) || ((this_00->field_0x8c & 2) != 0)) {
    if (sVar1 == 0x4c) {
      if ((*(byte *)(*(long *)(*(long *)&this_00->field_0x10 + 0x20) + 9) & 0x80) != 0) {
        activate(this);
        return;
      }
    }
    else if (sVar1 == 0x47) {
      w = *(QWidget **)(e + 0x10);
      if ((*(byte *)(*(long *)&w->field_0x8 + 0x31) & 4) != 0) {
        if (w == this_00->menubar) {
          this_00->menubar = (QWidget *)0x0;
        }
        removeWidgetRecursively(&this->super_QLayoutItem,&w->super_QObject);
        return;
      }
    }
    else if (sVar1 == 0xe) {
      if ((this_00->field_0x8c & 4) == 0) {
        activate(this);
        return;
      }
      QLayoutPrivate::doResize(this_00);
      return;
    }
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }